

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restraint.hpp
# Opt level: O0

void __thiscall OpenMD::Restraint::~Restraint(Restraint *this)

{
  Restraint *in_RDI;
  
  ~Restraint(in_RDI);
  operator_delete(in_RDI,0xb8);
  return;
}

Assistant:

virtual ~Restraint() {}